

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithBooleanParameter_Test::testBody
          (TEST_MockExpectedCall_callWithBooleanParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  UtestShell *pUVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  char *pcVar8;
  SimpleString local_1b8;
  MockNamedValue local_1a8;
  SimpleString local_158;
  SimpleString local_148;
  MockNamedValue local_138;
  MockNamedValue local_e8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  byte local_21;
  undefined1 local_20 [7];
  bool value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithBooleanParameter_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)local_20,"paramName");
  local_21 = 1;
  MockExpectedCall::withParameter
            (&((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall,
             (SimpleString *)local_20,true);
  pUVar5 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(local_48,pMVar1,local_20);
  pcVar6 = SimpleString::asCharString(local_48);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[9])
            (pUVar5,"bool",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xcf,pTVar7);
  SimpleString::~SimpleString(local_48);
  bVar3 = (bool)(local_21 & 1);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_98,pMVar1,local_20);
  bVar2 = MockNamedValue::getBoolValue(&local_98);
  MockNamedValue::~MockNamedValue(&local_98);
  if (bVar3 == bVar2) {
    pUVar5 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
               ,0xd0,pTVar7);
  }
  else {
    pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
    (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_e8,pMVar1,local_20);
    bVar2 = MockNamedValue::getBoolValue(&local_e8);
    pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
    (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_138,pMVar1,local_20);
    bVar3 = MockNamedValue::getBoolValue(&local_138);
    MockNamedValue::~MockNamedValue(&local_138);
    MockNamedValue::~MockNamedValue(&local_e8);
    if (bVar2 != bVar3) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                 ,0xd0);
    }
    pUVar5 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_148,0));
    pcVar6 = SimpleString::asCharString(&local_148);
    pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
    (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_1a8,pMVar1,local_20);
    MockNamedValue::getBoolValue(&local_1a8);
    ::StringFrom(SUB81(&local_158,0));
    pcVar8 = SimpleString::asCharString(&local_158);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
               ,0xd0,pTVar7);
    SimpleString::~SimpleString(&local_158);
    MockNamedValue::~MockNamedValue(&local_1a8);
    SimpleString::~SimpleString(&local_148);
  }
  pUVar5 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar4 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,local_20);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)(uVar4 & 1),"CHECK","call->hasInputParameterWithName(paramName)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xd1,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_1b8);
  pcVar6 = SimpleString::asCharString(&local_1b8);
  (*pUVar5->_vptr_UtestShell[0xc])
            (pUVar5,"funcName -> bool paramName: <true>",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xd2);
  SimpleString::~SimpleString(&local_1b8);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithBooleanParameter)
{
    const SimpleString paramName = "paramName";
    bool value = true;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("bool", call->getInputParameterType(paramName).asCharString());
    CHECK_EQUAL(value, call->getInputParameter(paramName).getBoolValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> bool paramName: <true>", call->callToString().asCharString());
}